

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintParagraph(cmDocumentationFormatter *this,ostream *os,char *text)

{
  char *text_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  std::operator<<(os,this->TextIndent);
  PrintColumn(this,os,text);
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter::PrintParagraph(std::ostream& os,
                                              const char* text)
{
  os << this->TextIndent;
  this->PrintColumn(os, text);
  os << "\n";
}